

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtensionalityClauseContainer.cpp
# Opt level: O2

ExtensionalityClauseIterator __thiscall
Saturation::ExtensionalityClauseContainer::activeIterator
          (ExtensionalityClauseContainer *this,TermList sort)

{
  TermList in_RDX;
  undefined1 local_60 [8];
  FilteredIterator<Lib::List<Saturation::ExtensionalityClause>::DelIterator,_Saturation::ExtensionalityClauseContainer::ActiveFilterFn,_true>
  local_58;
  
  Lib::
  DHMap<Kernel::TermList,_Lib::List<Saturation::ExtensionalityClause>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::find((DHMap<Kernel::TermList,_Lib::List<Saturation::ExtensionalityClause>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
          *)local_60,(TermList *)sort._content);
  if (local_60 == (undefined1  [8])0x0) {
    Lib::VirtualIterator<Saturation::ExtensionalityClause>::getEmpty();
  }
  else {
    local_58._inn._lst =
         Lib::
         DHMap<Kernel::TermList,_Lib::List<Saturation::ExtensionalityClause>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
         ::get((DHMap<Kernel::TermList,_Lib::List<Saturation::ExtensionalityClause>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                *)sort._content,in_RDX);
    local_58._inn._prev = (List<Saturation::ExtensionalityClause> *)0x0;
    local_58._inn._cur = (List<Saturation::ExtensionalityClause> *)0x0;
    local_58._next.super_OptionBase<Saturation::ExtensionalityClause>._isSome = false;
    local_58._next.super_OptionBase<Saturation::ExtensionalityClause>._1_7_ = 0;
    local_58._next.super_OptionBase<Saturation::ExtensionalityClause>._elem._elem.init.clause =
         (Clause *)0x0;
    local_58._next.super_OptionBase<Saturation::ExtensionalityClause>._elem._elem.init.literal =
         (Literal *)0x0;
    local_58._next.super_OptionBase<Saturation::ExtensionalityClause>._elem._elem.init.sort._content
         = (TermList)0;
    local_58._func._parent = (ExtensionalityClauseContainer *)sort._content;
    Lib::
    pvi<Lib::FilteredIterator<Lib::List<Saturation::ExtensionalityClause>::DelIterator,Saturation::ExtensionalityClauseContainer::ActiveFilterFn,true>>
              ((Lib *)this,&local_58);
  }
  return (ExtensionalityClauseIterator)(IteratorCore<Saturation::ExtensionalityClause> *)this;
}

Assistant:

ExtensionalityClauseIterator ExtensionalityClauseContainer::activeIterator(TermList sort) {
  if(_clausesBySort.find(sort)){
    return pvi(getFilteredDelIterator(
               ExtensionalityClauseList::DelIterator(_clausesBySort.get(sort)),
               ActiveFilterFn(*this)));
  } else {
    return ExtensionalityClauseIterator::getEmpty();
  }
}